

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::Snapshot::SetPolicy(Snapshot *this,PolicyID id,PolicyStatus status)

{
  PointerType pSVar1;
  PointerType pPVar2;
  bool local_49;
  undefined1 local_30 [8];
  iterator psi;
  bool previous_was_weak;
  PolicyStatus status_local;
  PolicyID id_local;
  Snapshot *this_local;
  
  psi.Position._7_1_ = 1;
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  local_30 = (undefined1  [8])(pSVar1->Policies).Tree;
  psi.Tree = (cmLinkedTree<cmState::PolicyStackEntry> *)(pSVar1->Policies).Position;
  while( true ) {
    local_49 = false;
    if ((psi.Position._7_1_ & 1) != 0) {
      pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
      local_49 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator!=
                           ((iterator *)local_30,pSVar1->PolicyRoot);
    }
    if (local_49 == false) break;
    pPVar2 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator->((iterator *)local_30);
    cmPolicies::PolicyMap::Set(&pPVar2->super_PolicyMap,id,status);
    pPVar2 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator->((iterator *)local_30);
    psi.Position._7_1_ = pPVar2->Weak & 1;
    cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++((iterator *)local_30);
  }
  return;
}

Assistant:

void cmState::Snapshot::SetPolicy(cmPolicies::PolicyID id,
                                  cmPolicies::PolicyStatus status)
{
  // Update the policy stack from the top to the top-most strong entry.
  bool previous_was_weak = true;
  for(cmLinkedTree<PolicyStackEntry>::iterator psi = this->Position->Policies;
      previous_was_weak && psi != this->Position->PolicyRoot; ++psi)
    {
    psi->Set(id, status);
    previous_was_weak = psi->Weak;
    }
}